

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,param *data)

{
  element_type *peVar1;
  long lVar2;
  string data_str;
  stringstream ss;
  string local_1b8;
  long local_198 [2];
  undefined1 local_188 [12];
  undefined4 auStack_17c [25];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  peVar1 = (data->impl_).super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**(code **)(*(long *)peVar1 + 0x18))(peVar1,local_188);
  lVar2 = *(long *)(local_198[0] + -0x18);
  *(undefined4 *)((long)auStack_17c + lVar2) = 4;
  std::ios::clear((int)&local_1b8 + (int)lVar2 + 0x20);
  std::__cxx11::stringbuf::str();
  operator=(this,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void data_ptr::operator = (const T& data) {
        std::stringstream ss;
        ss << data;
        ss.exceptions(std::ios::failbit);
        std::string data_str = ss.str();
        this->operator =(data_str);
    }